

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::startListening(FileServer *this)

{
  pointer pIVar1;
  mutex_type *in_RDI;
  bool bVar2;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  byte local_1;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x134ac7);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_RDI);
  pIVar1 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134ae4);
  bVar2 = (pIVar1->isListening & 1U) == 0;
  if (bVar2) {
    pIVar1 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134b02);
    pIVar1->isListening = true;
  }
  else {
    local_1 = 0;
  }
  uVar3 = (uint)!bVar2;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x134b18);
  if (uVar3 == 0) {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool FileServer::startListening() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        if (m_impl->isListening) {
            return false;
        }

        m_impl->isListening = true;
    }

    return true;
}